

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void integer_suite::test_uint16_4(void)

{
  unsigned_short uVar1;
  char input [5];
  decoder_type decoder;
  undefined4 local_168;
  value local_164;
  value_type local_160 [8];
  basic_decoder<char> local_158;
  
  local_158.input.tail = local_160 + 4;
  builtin_memcpy(local_160,"1234",5);
  local_158.input.head = local_160;
  memset(&local_158.current,0,0x120);
  local_158.current.code = uninitialized;
  local_158.current.view.head = (const_pointer)0x0;
  local_158.current.view.tail = (const_pointer)0x0;
  trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
  local_164 = local_158.current.code;
  local_168 = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x304,"void integer_suite::test_uint16_4()",&local_164,&local_168);
  uVar1 = trial::protocol::json::detail::basic_decoder<char>::unsigned_value<unsigned_short>
                    (&local_158);
  local_168 = CONCAT22(local_168._2_2_,uVar1);
  local_164 = 0x4d2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_short,unsigned_int>
            ("decoder.unsigned_value<std::uint16_t>()","1234U",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x305,"void integer_suite::test_uint16_4()",&local_168,&local_164);
  if (error_unexpected_token < local_158.current.code) {
    if (local_158.current.code == end) {
      local_158.current.code = error_unexpected_token;
    }
    else {
      trial::protocol::json::detail::basic_decoder<char>::assume_next(&local_158);
    }
  }
  local_168 = 0;
  local_164 = local_158.current.code;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x307,"void integer_suite::test_uint16_4()",&local_164,&local_168);
  return;
}

Assistant:

void test_uint16_4()
{
    const char input[] = "1234";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.unsigned_value<std::uint16_t>(), 1234U);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}